

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

int event_track::write_to_segmented_event_track_file
              (string *out_file,
              vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
              *in_emsg_list,uint32_t track_id,uint64_t pt_off_start,uint64_t pt_off_end,string *urn,
              uint64_t seg_duration,uint32_t timescale)

{
  uint uVar1;
  ostream *poVar2;
  uint64_t timestamp_tfdt;
  uint64_t next_tfdt;
  uint64_t uVar3;
  uint64_t uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sparse_moov;
  vector<event_track::EventSample,_std::allocator<event_track::EventSample>_> samples_in_segment;
  ofstream ot;
  int aiStack_210 [120];
  
  base64_decode(&sparse_moov,&moov_64_enc_abi_cxx11_);
  fmp4_stream::set_track_id(&sparse_moov,track_id);
  uVar1 = timescale >> 0x18 | (timescale & 0xff0000) >> 8 | (timescale & 0xff00) << 8 |
          timescale << 0x18;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x1c) = uVar1;
  *(uint *)(sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0xf4) = uVar1;
  *(uint32_t *)
   (sparse_moov.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x220) =
       track_id >> 0x18 | (track_id & 0xff0000) >> 8 | (track_id & 0xff00) << 8 | track_id << 0x18;
  set_evte(&sparse_moov);
  std::ofstream::ofstream(&ot,(string *)out_file,_S_bin);
  uVar4 = pt_off_end - pt_off_start;
  if (seg_duration != 0) {
    uVar4 = seg_duration;
  }
  if (*(int *)((long)aiStack_210 + *(long *)(_ot + -0x18)) == 0) {
    std::ostream::write((char *)&ot,0x1627d0);
    std::ostream::write((char *)&ot,
                        (long)sparse_moov.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    while (pt_off_start <= pt_off_end && pt_off_end - pt_off_start != 0) {
      uVar3 = pt_off_end - pt_off_start;
      if (pt_off_start + uVar4 <= pt_off_end) {
        uVar3 = uVar4;
      }
      samples_in_segment.
      super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      samples_in_segment.
      super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      samples_in_segment.
      super__Vector_base<event_track::EventSample,_std::allocator<event_track::EventSample>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      next_tfdt = 0;
      find_event_samples(in_emsg_list,&samples_in_segment,pt_off_start,uVar3 + pt_off_start,false);
      write_evt_samples_as_fmp4_fragment
                (&samples_in_segment,(ostream *)&ot,timestamp_tfdt,track_id,next_tfdt,0);
      std::vector<event_track::EventSample,_std::allocator<event_track::EventSample>_>::~vector
                (&samples_in_segment);
      pt_off_start = uVar3 + pt_off_start;
    }
    if (*(int *)((long)aiStack_210 + *(long *)(_ot + -0x18)) == 0) {
      std::ofstream::close();
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"*** wrote sparse track file: ");
    poVar2 = std::operator<<(poVar2,(string *)out_file);
    poVar2 = std::operator<<(poVar2,"  ***");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::~ofstream(&ot);
  Catch::clara::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sparse_moov);
  return 0;
}

Assistant:

int event_track::write_to_segmented_event_track_file(
	const std::string& out_file,
	std::vector<event_track::DASHEventMessageBoxv1> &in_emsg_list,
	uint32_t track_id, 
	uint64_t pt_off_start, 
	uint64_t pt_off_end, 
	const std::string& urn,
	uint64_t seg_duration,
	uint32_t timescale)
{
	std::vector<uint8_t> sparse_moov = base64_decode(moov_64_enc);
	set_track_id(sparse_moov, track_id);
	
	// write back the timescale mvhd / mhd
	fmp4_write_uint32(timescale, (char *)&sparse_moov[28]);
	fmp4_write_uint32(timescale, (char *)&sparse_moov[244]);
	fmp4_write_uint32(track_id, (char*)&sparse_moov[544]);

	event_track::set_evte(sparse_moov);

	std::ofstream ot(out_file, std::ios::binary);
	//cout << sparse_moov.size() << endl;

	if (seg_duration == 0)
		seg_duration = pt_off_end - pt_off_start;

	if (ot.good())
	{
		// write the ftyp header
		ot.write((char *)&sparse_ftyp[0], 20);
		ot.write((const char *)&sparse_moov[0], sparse_moov.size());
		uint64_t current_tfdt = 0;
		uint64_t it_time = pt_off_start;

		while (it_time < pt_off_end)
		{
			uint64_t actual_duration = seg_duration; 
			if (it_time + seg_duration > pt_off_end)
				actual_duration = pt_off_end - it_time;

			std::vector<event_track::EventSample> samples_in_segment;
			find_event_samples(in_emsg_list, samples_in_segment, it_time, it_time + actual_duration);
			event_track::write_evt_samples_as_fmp4_fragment(samples_in_segment, ot, it_time,track_id , it_time + actual_duration);
			it_time +=actual_duration;
		}
		if(ot.good())
		   ot.close();

		std::cout << "*** wrote sparse track file: " << out_file << "  ***" << std::endl;
	}
	return 0;
}